

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableNT.cpp
# Opt level: O2

size_t __thiscall adios2::VariableNT::StructFields(VariableNT *this)

{
  VariableBase *pointer;
  size_t sVar1;
  allocator local_f3;
  allocator local_f2;
  allocator local_f1;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  string local_30;
  
  pointer = this->m_Variable;
  std::__cxx11::string::string
            ((string *)&local_30,"in call to VariableNT::StructFields",(allocator *)&local_f0);
  helper::CheckForNullptr<adios2::core::VariableBase>(pointer,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (*(int *)(this->m_Variable + 0x28) != 0x10) {
    std::__cxx11::string::string((string *)&local_f0,"bindings::CXX11",&local_f1);
    std::__cxx11::string::string((string *)&local_50,"VariableNT",&local_f2);
    std::__cxx11::string::string((string *)&local_70,"StructFields",&local_f3);
    adios2::ToString_abi_cxx11_((DataType)&local_d0);
    std::operator+(&local_b0,"invalid data type ",&local_d0);
    std::operator+(&local_90,&local_b0,", only Struct type supports this API");
    helper::Throw<std::runtime_error>(&local_f0,&local_50,&local_70,&local_90,-1);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  sVar1 = adios2::core::StructDefinition::Fields();
  return sVar1;
}

Assistant:

size_t VariableNT::StructFields() const
{
    helper::CheckForNullptr(m_Variable, "in call to VariableNT::StructFields");
    if (m_Variable->m_Type != DataType::Struct)
    {
        helper::Throw<std::runtime_error>("bindings::CXX11", "VariableNT", "StructFields",
                                          "invalid data type " + ToString(m_Variable->m_Type) +
                                              ", only Struct type supports this API");
    }
    if (reinterpret_cast<core::VariableStruct *>(m_Variable)->m_ReadStructDefinition)
        return reinterpret_cast<core::VariableStruct *>(m_Variable)
            ->m_ReadStructDefinition->Fields();
    else
        return reinterpret_cast<core::VariableStruct *>(m_Variable)
            ->m_WriteStructDefinition->Fields();
}